

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2f151d::ParameterPackExpansion::printLeft
          (ParameterPackExpansion *this,OutputStream *S)

{
  StringView local_78;
  uint local_64;
  uint local_60;
  uint E;
  uint I;
  size_t local_48;
  size_t StreamPos;
  SwapAndRestore<unsigned_int> SavePackMax;
  SwapAndRestore<unsigned_int> SavePackIdx;
  uint Max;
  OutputStream *S_local;
  ParameterPackExpansion *this_local;
  
  SwapAndRestore<unsigned_int>::SwapAndRestore
            ((SwapAndRestore<unsigned_int> *)&SavePackMax.OriginalValue,&S->CurrentPackIndex,
             0xffffffff);
  SwapAndRestore<unsigned_int>::SwapAndRestore
            ((SwapAndRestore<unsigned_int> *)&StreamPos,&S->CurrentPackMax,0xffffffff);
  local_48 = OutputStream::getCurrentPosition(S);
  Node::print(this->Child,S);
  if (S->CurrentPackMax == 0xffffffff) {
    StringView::StringView((StringView *)&I,"...");
    OutputStream::operator+=(S,_I);
    E = 1;
  }
  else if (S->CurrentPackMax == 0) {
    OutputStream::setCurrentPosition(S,local_48);
    E = 1;
  }
  else {
    local_60 = 1;
    local_64 = S->CurrentPackMax;
    for (; local_60 < local_64; local_60 = local_60 + 1) {
      StringView::StringView(&local_78,", ");
      OutputStream::operator+=(S,local_78);
      S->CurrentPackIndex = local_60;
      Node::print(this->Child,S);
    }
    E = 0;
  }
  SwapAndRestore<unsigned_int>::~SwapAndRestore((SwapAndRestore<unsigned_int> *)&StreamPos);
  SwapAndRestore<unsigned_int>::~SwapAndRestore
            ((SwapAndRestore<unsigned_int> *)&SavePackMax.OriginalValue);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    constexpr unsigned Max = std::numeric_limits<unsigned>::max();
    SwapAndRestore<unsigned> SavePackIdx(S.CurrentPackIndex, Max);
    SwapAndRestore<unsigned> SavePackMax(S.CurrentPackMax, Max);
    size_t StreamPos = S.getCurrentPosition();

    // Print the first element in the pack. If Child contains a ParameterPack,
    // it will set up S.CurrentPackMax and print the first element.
    Child->print(S);

    // No ParameterPack was found in Child. This can occur if we've found a pack
    // expansion on a <function-param>.
    if (S.CurrentPackMax == Max) {
      S += "...";
      return;
    }

    // We found a ParameterPack, but it has no elements. Erase whatever we may
    // of printed.
    if (S.CurrentPackMax == 0) {
      S.setCurrentPosition(StreamPos);
      return;
    }

    // Else, iterate through the rest of the elements in the pack.
    for (unsigned I = 1, E = S.CurrentPackMax; I < E; ++I) {
      S += ", ";
      S.CurrentPackIndex = I;
      Child->print(S);
    }
  }